

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::FastWriter::FastWriter(FastWriter *this)

{
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__FastWriter_00120d00;
  (this->document_)._M_dataplus._M_p = (pointer)&(this->document_).field_2;
  (this->document_)._M_string_length = 0;
  (this->document_).field_2._M_local_buf[0] = '\0';
  this->yamlCompatiblityEnabled_ = false;
  this->dropNullPlaceholders_ = false;
  this->omitEndingLineFeed_ = false;
  return;
}

Assistant:

FastWriter::FastWriter()
    : yamlCompatiblityEnabled_(false), dropNullPlaceholders_(false),
      omitEndingLineFeed_(false) {}